

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

void secp256k1_musig_keyaggcoef_internal
               (secp256k1_scalar *r,uchar *pks_hash,secp256k1_ge *pk,secp256k1_ge *second_pk)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t buflen;
  uchar buf [33];
  secp256k1_sha256 sha;
  
  iVar1 = secp256k1_ge_is_infinity(pk);
  if (iVar1 == 0) {
    iVar1 = secp256k1_ge_is_infinity(second_pk);
    if (iVar1 == 0) {
      iVar1 = secp256k1_ge_eq_var(pk,second_pk);
      if (iVar1 != 0) {
        secp256k1_scalar_set_int(r,1);
        return;
      }
    }
    buflen = 0x21;
    secp256k1_musig_keyaggcoef_sha256(&sha);
    secp256k1_sha256_write(&sha,pks_hash,0x20);
    iVar1 = secp256k1_eckey_pubkey_serialize(pk,buf,&buflen,1);
    if ((iVar1 != 0) && (buflen == 0x21)) {
      secp256k1_sha256_write(&sha,buf,0x21);
      secp256k1_sha256_finalize(&sha,buf);
      secp256k1_scalar_set_b32(r,buf,(int *)0x0);
      return;
    }
    pcVar3 = "test condition failed: ret && buflen == sizeof(buf)";
    uVar2 = 0x87;
  }
  else {
    pcVar3 = "test condition failed: !secp256k1_ge_is_infinity(pk)";
    uVar2 = 0x77;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/keyagg_impl.h"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void secp256k1_musig_keyaggcoef_internal(secp256k1_scalar *r, const unsigned char *pks_hash, secp256k1_ge *pk, const secp256k1_ge *second_pk) {
    VERIFY_CHECK(!secp256k1_ge_is_infinity(pk));

    if (!secp256k1_ge_is_infinity(second_pk)
          && secp256k1_ge_eq_var(pk, second_pk)) {
        secp256k1_scalar_set_int(r, 1);
    } else {
        secp256k1_sha256 sha;
        unsigned char buf[33];
        size_t buflen = sizeof(buf);
        int ret;
        secp256k1_musig_keyaggcoef_sha256(&sha);
        secp256k1_sha256_write(&sha, pks_hash, 32);
        ret = secp256k1_eckey_pubkey_serialize(pk, buf, &buflen, 1);
#ifdef VERIFY
        /* Serialization does not fail since the pk is not the point at infinity
         * (according to this function's precondition). */
        VERIFY_CHECK(ret && buflen == sizeof(buf));
#else
        (void) ret;
#endif
        secp256k1_sha256_write(&sha, buf, sizeof(buf));
        secp256k1_sha256_finalize(&sha, buf);
        secp256k1_scalar_set_b32(r, buf, NULL);
    }
}